

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Length __thiscall tcmalloc::PageHeap::ReleaseAtLeastNPages(PageHeap *this,Length num_pages)

{
  int iVar1;
  pointer pSVar2;
  Length LVar3;
  bool bVar4;
  Length released_len;
  SpanList *slist;
  Span *local_38;
  Span *s;
  Length LStack_28;
  int i;
  Length released_pages;
  Length num_pages_local;
  PageHeap *this_local;
  
  LStack_28 = 0;
  released_pages = num_pages;
  num_pages_local = (Length)this;
  do {
    bVar4 = false;
    if (LStack_28 < released_pages) {
      bVar4 = (this->stats_).free_bytes != 0;
    }
    if (!bVar4) {
      return LStack_28;
    }
    s._4_4_ = 0;
    while (s._4_4_ < 0x81 && LStack_28 < released_pages) {
      if (0x80 < (uint)this->release_index_) {
        this->release_index_ = 0;
      }
      if (this->release_index_ == 0x80) {
        bVar4 = std::
                set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
                ::empty(&this->large_normal_);
        if (!bVar4) {
          slist = (SpanList *)
                  std::
                  set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
                  ::begin(&this->large_normal_);
          pSVar2 = std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator->
                             ((_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength> *)&slist);
          local_38 = pSVar2->span;
LAB_001346c1:
          LVar3 = ReleaseSpan(this,local_38);
          if (LVar3 == 0) {
            return LStack_28;
          }
          LStack_28 = LStack_28 + LVar3;
        }
      }
      else {
        iVar1 = this->release_index_;
        bVar4 = DLL_IsEmpty(&this->free_[iVar1].normal);
        if (!bVar4) {
          local_38 = this->free_[iVar1].normal.prev;
          goto LAB_001346c1;
        }
      }
      s._4_4_ = s._4_4_ + 1;
      this->release_index_ = this->release_index_ + 1;
    }
  } while( true );
}

Assistant:

Length PageHeap::ReleaseAtLeastNPages(Length num_pages) {
  ASSERT(lock_.IsHeld());
  Length released_pages = 0;

  // Round robin through the lists of free spans, releasing a
  // span from each list.  Stop after releasing at least num_pages
  // or when there is nothing more to release.
  while (released_pages < num_pages && stats_.free_bytes > 0) {
    for (int i = 0; i < kMaxPages+1 && released_pages < num_pages;
         i++, release_index_++) {
      Span *s;
      if (release_index_ > kMaxPages) release_index_ = 0;

      if (release_index_ == kMaxPages) {
        if (large_normal_.empty()) {
          continue;
        }
        s = (large_normal_.begin())->span;
      } else {
        SpanList* slist = &free_[release_index_];
        if (DLL_IsEmpty(&slist->normal)) {
          continue;
        }
        s = slist->normal.prev;
      }
      // TODO(todd) if the remaining number of pages to release
      // is significantly smaller than s->length, and s is on the
      // large freelist, should we carve s instead of releasing?
      // the whole thing?
      Length released_len = ReleaseSpan(s);
      // Some systems do not support release
      if (released_len == 0) return released_pages;
      released_pages += released_len;
    }
  }
  return released_pages;
}